

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

NewCovergroupExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::NewCovergroupExpression,slang::ast::Type_const&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
          (BumpAllocator *this,Type *args,
          span<const_slang::ast::Expression_*,_18446744073709551615UL> *args_1,SourceRange *args_2)

{
  pointer ppEVar1;
  size_t sVar2;
  SourceLocation SVar3;
  SourceLocation SVar4;
  NewCovergroupExpression *pNVar5;
  
  pNVar5 = (NewCovergroupExpression *)allocate(this,0x40,8);
  ppEVar1 = args_1->_M_ptr;
  sVar2 = (args_1->_M_extent)._M_extent_value;
  SVar3 = args_2->startLoc;
  SVar4 = args_2->endLoc;
  (pNVar5->super_Expression).kind = NewCovergroup;
  (pNVar5->super_Expression).type.ptr = args;
  (pNVar5->super_Expression).constant = (ConstantValue *)0x0;
  (pNVar5->super_Expression).syntax = (ExpressionSyntax *)0x0;
  (pNVar5->super_Expression).sourceRange.startLoc = SVar3;
  (pNVar5->super_Expression).sourceRange.endLoc = SVar4;
  (pNVar5->arguments)._M_ptr = ppEVar1;
  (pNVar5->arguments)._M_extent._M_extent_value = sVar2;
  return pNVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }